

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noccout.c
# Opt level: O1

Item * vectorize_replacement_item(Item *q)

{
  Item *pIVar1;
  List *pLVar2;
  
  pIVar1 = (Item *)0x0;
  pLVar2 = vectorize_replacements;
  if (vectorize_replacements != (List *)0x0) {
    do {
      pLVar2 = pLVar2->next;
      if (pLVar2 == vectorize_replacements) {
        return (Item *)0x0;
      }
    } while ((pLVar2->element).itm != q);
    pIVar1 = pLVar2->next;
  }
  return pIVar1;
}

Assistant:

Item* vectorize_replacement_item(Item* q) {
	Item* q1;
	if (vectorize_replacements) {
		ITERATE(q1, vectorize_replacements) {
			if (ITM(q1) == q) {
				return q1->next;
			}			
		}
	}
	return (Item*)0;
}